

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O1

Bounds3f * __thiscall
pbrt::AnimatedTransform::MotionBounds
          (Bounds3f *__return_storage_ptr__,AnimatedTransform *this,Bounds3f *b)

{
  Point3<float> *pPVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  Bounds3f *pBVar7;
  Bounds3f *pBVar8;
  Bounds3f *pBVar9;
  int corner;
  uint uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  float fVar20;
  Bounds3f local_88;
  Bounds3f local_70;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  if (this->actuallyAnimated == false) {
    Transform::operator()(__return_storage_ptr__,&this->startTransform,b);
  }
  else if (this->hasRotation == false) {
    Transform::operator()(&local_88,&this->startTransform,b);
    Transform::operator()(&local_70,&this->endTransform,b);
    (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.x = 3.4028235e+38;
    (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.y = 3.4028235e+38;
    *(undefined8 *)&(__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.z =
         0xff7fffff7f7fffff;
    auVar14._8_4_ = 0xff7fffff;
    auVar14._0_8_ = 0xff7fffffff7fffff;
    auVar14._12_4_ = 0xff7fffff;
    uVar4 = vmovlps_avx(auVar14);
    (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.y = (float)(int)uVar4;
    (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.z =
         (float)(int)((ulong)uVar4 >> 0x20);
    auVar15._8_8_ = 0;
    auVar15._0_4_ = local_70.pMin.super_Tuple3<pbrt::Point3,_float>.x;
    auVar15._4_4_ = local_70.pMin.super_Tuple3<pbrt::Point3,_float>.y;
    auVar17._8_8_ = 0;
    auVar17._0_4_ = local_88.pMin.super_Tuple3<pbrt::Point3,_float>.x;
    auVar17._4_4_ = local_88.pMin.super_Tuple3<pbrt::Point3,_float>.y;
    auVar14 = vminps_avx(auVar15,auVar17);
    auVar15 = vminss_avx(ZEXT416((uint)local_70.pMin.super_Tuple3<pbrt::Point3,_float>.z),
                         ZEXT416((uint)local_88.pMin.super_Tuple3<pbrt::Point3,_float>.z));
    uVar4 = vmovlps_avx(auVar14);
    (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar4;
    (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.y =
         (float)(int)((ulong)uVar4 >> 0x20);
    (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.z = auVar15._0_4_;
    auVar16._8_8_ = 0;
    auVar16._0_4_ = local_88.pMax.super_Tuple3<pbrt::Point3,_float>.x;
    auVar16._4_4_ = local_88.pMax.super_Tuple3<pbrt::Point3,_float>.y;
    auVar18._8_8_ = 0;
    auVar18._0_4_ = local_70.pMax.super_Tuple3<pbrt::Point3,_float>.x;
    auVar18._4_4_ = local_70.pMax.super_Tuple3<pbrt::Point3,_float>.y;
    auVar14 = vmaxps_avx(auVar18,auVar16);
    auVar15 = vmaxss_avx(ZEXT416((uint)local_70.pMax.super_Tuple3<pbrt::Point3,_float>.z),
                         ZEXT416((uint)local_88.pMax.super_Tuple3<pbrt::Point3,_float>.z));
    uVar4 = vmovlps_avx(auVar14);
    (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar4;
    (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.y =
         (float)(int)((ulong)uVar4 >> 0x20);
    (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.z = auVar15._0_4_;
  }
  else {
    (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.x = 3.4028235e+38;
    (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.y = 3.4028235e+38;
    *(undefined8 *)&(__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.z =
         0xff7fffff7f7fffff;
    auVar11._8_4_ = 0xff7fffff;
    auVar11._0_8_ = 0xff7fffffff7fffff;
    auVar11._12_4_ = 0xff7fffff;
    uVar4 = vmovlps_avx(auVar11);
    (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.y = (float)(int)uVar4;
    (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.z =
         (float)(int)((ulong)uVar4 >> 0x20);
    auVar19 = ZEXT464((uint)(__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.z);
    uVar2 = (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.x;
    uVar5 = (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.y;
    local_58._4_4_ = uVar5;
    local_58._0_4_ = uVar2;
    local_58._8_8_ = 0;
    uVar3 = (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.x;
    uVar6 = (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.y;
    local_48._4_4_ = uVar6;
    local_48._0_4_ = uVar3;
    local_48._8_8_ = 0;
    fVar20 = -3.4028235e+38;
    uVar10 = 0;
    pPVar1 = &b->pMax;
    do {
      pBVar7 = (Bounds3f *)pPVar1;
      if ((uVar10 & 1) == 0) {
        pBVar7 = b;
      }
      pBVar8 = (Bounds3f *)pPVar1;
      if ((uVar10 & 2) == 0) {
        pBVar8 = b;
      }
      pBVar9 = (Bounds3f *)pPVar1;
      if (uVar10 < 4) {
        pBVar9 = b;
      }
      local_70.pMin.super_Tuple3<pbrt::Point3,_float>.z =
           (pBVar9->pMin).super_Tuple3<pbrt::Point3,_float>.z;
      auVar14 = vinsertps_avx(ZEXT416((uint)(pBVar7->pMin).super_Tuple3<pbrt::Point3,_float>.x),
                              ZEXT416((uint)(pBVar8->pMin).super_Tuple3<pbrt::Point3,_float>.y),0x10
                             );
      local_70.pMin.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar14);
      BoundPointMotion(&local_88,this,&local_70.pMin);
      auVar12._8_8_ = 0;
      auVar12._0_4_ = local_88.pMin.super_Tuple3<pbrt::Point3,_float>.x;
      auVar12._4_4_ = local_88.pMin.super_Tuple3<pbrt::Point3,_float>.y;
      local_58 = vminps_avx(auVar12,local_58);
      auVar15 = vminss_avx(ZEXT416((uint)local_88.pMin.super_Tuple3<pbrt::Point3,_float>.z),
                           ZEXT416(auVar19._0_4_));
      auVar19 = ZEXT1664(auVar15);
      auVar13._8_8_ = 0;
      auVar13._0_4_ = local_88.pMax.super_Tuple3<pbrt::Point3,_float>.x;
      auVar13._4_4_ = local_88.pMax.super_Tuple3<pbrt::Point3,_float>.y;
      local_48 = vmaxps_avx(auVar13,local_48);
      auVar14 = vmaxss_avx(ZEXT416((uint)local_88.pMax.super_Tuple3<pbrt::Point3,_float>.z),
                           ZEXT416((uint)fVar20));
      fVar20 = auVar14._0_4_;
      uVar10 = uVar10 + 1;
    } while (uVar10 != 8);
    uVar4 = vmovlps_avx(local_58);
    (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar4;
    (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.y =
         (float)(int)((ulong)uVar4 >> 0x20);
    uVar4 = vmovlps_avx(local_48);
    (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar4;
    (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.y =
         (float)(int)((ulong)uVar4 >> 0x20);
    (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.z = auVar15._0_4_;
    (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.z = fVar20;
  }
  return __return_storage_ptr__;
}

Assistant:

Bounds3f AnimatedTransform::MotionBounds(const Bounds3f &b) const {
    // Handle easy cases for _Bounds3f_ motion bounds
    if (!actuallyAnimated)
        return startTransform(b);
    if (!hasRotation)
        return Union(startTransform(b), endTransform(b));

    // Return motion bounds accounting for animated rotation
    Bounds3f bounds;
    for (int corner = 0; corner < 8; ++corner)
        bounds = Union(bounds, BoundPointMotion(b.Corner(corner)));
    return bounds;
}